

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O3

QString * __thiscall
QFileSystemModelPrivate::filePath
          (QString *__return_storage_ptr__,QFileSystemModelPrivate *this,QModelIndex *index)

{
  ulong uVar1;
  Data *pDVar2;
  QArrayData *pQVar3;
  QString *pQVar4;
  QAbstractItemModel *pQVar5;
  uint uVar6;
  char16_t *pcVar7;
  long in_FS_OFFSET;
  bool bVar8;
  QArrayData *local_98;
  QString *pQStack_90;
  QAbstractItemModel *local_88;
  undefined8 local_78;
  QString *pQStack_70;
  QAbstractItemModel *local_68;
  QArrayDataPointer<QString> local_58;
  undefined2 local_32;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (((index->r < 0) || (index->c < 0)) || ((index->m).ptr == (QAbstractItemModel *)0x0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
  }
  else {
    local_58.d = (Data *)0x0;
    local_58.ptr = (QString *)0x0;
    local_58.size = 0;
    pQVar3 = *(QArrayData **)index;
    pQStack_70 = (QString *)index->i;
    local_68 = (index->m).ptr;
    local_78._4_4_ = (uint)((ulong)pQVar3 >> 0x20);
    local_78._0_4_ = (uint)pQVar3;
    uVar6 = local_78._4_4_ | (uint)local_78;
    local_78 = pQVar3;
    if (local_68 != (QAbstractItemModel *)0x0 && -1 < (int)uVar6) {
      do {
        if ((pQStack_70 == (QString *)0x0) ||
           (QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                      ((QMovableArrayOps<QString> *)&local_58,0,pQStack_70),
           local_68 != (QAbstractItemModel *)0x0)) {
          (**(code **)(*(long *)local_68 + 0x68))(&local_98,local_68,&local_78);
        }
        else {
          local_98 = (QArrayData *)0xffffffffffffffff;
          pQStack_90 = (QString *)0x0;
          local_88 = (QAbstractItemModel *)0x0;
        }
        local_68 = local_88;
        local_78 = local_98;
        pQVar3 = local_78;
        pQStack_70 = pQStack_90;
        local_78._0_4_ = (uint)local_98;
        bVar8 = -1 < (int)(uint)local_78;
        local_78 = pQVar3;
      } while (((bVar8) && (-1 < (long)local_98)) && (local_88 != (QAbstractItemModel *)0x0));
    }
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_32 = 0x2f;
    QtPrivate::QStringList_join((QList_conflict *)&local_98,(QChar *)&local_58,(longlong)&local_32);
    QDir::fromNativeSeparators((QString *)__return_storage_ptr__);
    if (local_98 != (QArrayData *)0x0) {
      LOCK();
      (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_98,2,0x10);
      }
    }
    uVar1 = (__return_storage_ptr__->d).size;
    if (2 < uVar1) {
      pDVar2 = (__return_storage_ptr__->d).d;
      if ((pDVar2 == (Data *)0x0) ||
         (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QString::reallocData((longlong)__return_storage_ptr__,(AllocationOption)uVar1);
      }
      pcVar7 = (__return_storage_ptr__->d).ptr;
      if (*pcVar7 == L'/') {
        pDVar2 = (__return_storage_ptr__->d).d;
        if ((pDVar2 == (Data *)0x0) ||
           (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QString::reallocData
                    ((longlong)__return_storage_ptr__,
                     (AllocationOption)(__return_storage_ptr__->d).size);
          pcVar7 = (__return_storage_ptr__->d).ptr;
        }
        if (pcVar7[1] == L'/') {
          QString::mid((longlong)&local_98,(longlong)__return_storage_ptr__);
          pQVar3 = &((__return_storage_ptr__->d).d)->super_QArrayData;
          pQVar4 = (QString *)(__return_storage_ptr__->d).ptr;
          (__return_storage_ptr__->d).d = (Data *)local_98;
          (__return_storage_ptr__->d).ptr = (char16_t *)pQStack_90;
          pQVar5 = (QAbstractItemModel *)(__return_storage_ptr__->d).size;
          (__return_storage_ptr__->d).size = (qsizetype)local_88;
          local_98 = pQVar3;
          pQStack_90 = pQVar4;
          local_88 = pQVar5;
          if (pQVar3 != (QArrayData *)0x0) {
            LOCK();
            (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar3,2,0x10);
            }
          }
        }
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QString QFileSystemModelPrivate::filePath(const QModelIndex &index) const
{
    Q_Q(const QFileSystemModel);
    Q_UNUSED(q);
    if (!index.isValid())
        return QString();
    Q_ASSERT(index.model() == q);

    QStringList path;
    QModelIndex idx = index;
    while (idx.isValid()) {
        QFileSystemModelPrivate::QFileSystemNode *dirNode = node(idx);
        if (dirNode)
            path.prepend(dirNode->fileName);
        idx = idx.parent();
    }
    QString fullPath = QDir::fromNativeSeparators(path.join(QDir::separator()));
#if !defined(Q_OS_WIN)
    if ((fullPath.size() > 2) && fullPath[0] == u'/' && fullPath[1] == u'/')
        fullPath = fullPath.mid(1);
#else
    if (fullPath.length() == 2 && fullPath.endsWith(u':'))
        fullPath.append(u'/');
#endif
    return fullPath;
}